

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase146::run(TestCase146 *this)

{
  Reader reader;
  bool bVar1;
  RefOrVoid<kj::AsyncIoProvider> ioProvider;
  RefOrVoid<kj::AsyncIoStream> stream;
  AsyncIoStream *pAVar2;
  size_t __n;
  char *__n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  Type *func;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func_00;
  Type *extraout_RDX_01;
  int __flags;
  char *pcVar3;
  Reader RVar4;
  ReaderOptions receiveOptions;
  undefined8 in_stack_fffffffffffff428;
  int local_b70;
  bool local_b69;
  int local_b68;
  bool local_b62;
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  undefined1 *puStack_b60;
  bool _kj_shouldLog_7;
  int *local_b58;
  Maybe<kj::Exception> local_b50;
  bool local_9e9;
  RequestHook **ppRStack_9e8;
  bool _kj_shouldLog_6;
  int *local_9e0;
  Maybe<kj::Exception> local_9d8;
  undefined1 local_878 [8];
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2_1;
  Pipeline local_828;
  Client local_800;
  Client local_7e8;
  undefined1 local_7d0 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2_1;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise_1;
  Pipeline local_748;
  Client local_720;
  undefined1 local_708 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest_1;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise_1;
  Client local_688;
  Maybe<capnp::MessageSize> local_670;
  undefined1 local_658 [8];
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request_1;
  int local_618;
  bool _kj_shouldLog_5;
  int local_610;
  bool _kj_shouldLog_4;
  SegmentReader *pSStack_608;
  bool _kj_shouldLog_3;
  SegmentReader *pSStack_600;
  CapTableReader *local_5f8;
  void *pvStack_5f0;
  WirePointer *local_5e8;
  StructDataBitCount SStack_5e0;
  StructPointerCount SStack_5dc;
  undefined2 uStack_5da;
  undefined1 auStack_5d0 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  bool local_579;
  undefined1 auStack_578 [7];
  bool _kj_shouldLog_2;
  size_t local_570;
  undefined1 local_568 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  int local_520;
  bool _kj_shouldLog_1;
  undefined1 local_518 [7];
  bool _kj_shouldLog;
  undefined1 local_4e0 [8];
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Pipeline local_490;
  Client local_468;
  Client local_450;
  undefined1 local_438 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Pipeline local_3b0;
  Client local_388;
  undefined1 local_370 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  Client local_2f0;
  Maybe<capnp::MessageSize> local_2d8;
  undefined1 local_2c0 [8];
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  undefined1 local_278 [8];
  Client client;
  undefined1 *local_258;
  undefined1 local_250 [24];
  Promise<void> disconnectPromise;
  undefined1 local_228 [7];
  bool disconnected;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  undefined1 local_200 [8];
  TwoPartyVatNetwork network;
  undefined1 local_70 [8];
  PipeThread serverThread;
  int local_48;
  int reverseCallCount;
  int handleCount;
  int callCount;
  AsyncIoContext ioContext;
  TestCase146 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  reverseCallCount = 0;
  local_48 = 0;
  serverThread.pipe.ptr._4_4_ = 0;
  ioProvider = kj::Own<kj::AsyncIoProvider>::operator*
                         ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  runServer((PipeThread *)local_70,ioProvider,&reverseCallCount,&stack0xffffffffffffffb8);
  stream = kj::Own<kj::AsyncIoStream>::operator*((Own<kj::AsyncIoStream> *)&serverThread.thread.ptr)
  ;
  rpcClient.super_RpcSystemBase.impl.ptr = (Impl *)0x0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&rpcClient.super_RpcSystemBase.impl.ptr);
  receiveOptions._8_8_ = 0;
  receiveOptions.traversalLimitInWords = (uint64_t)rpcClient.super_RpcSystemBase.impl.ptr;
  pcVar3 = (char *)0x0;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            ((TwoPartyVatNetwork *)local_200,stream,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)local_228,
             (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
              *)local_200);
  disconnectPromise.super_PromiseBase.node.ptr._7_1_ = 0;
  TwoPartyVatNetwork::onDisconnect((TwoPartyVatNetwork *)local_250);
  local_258 = (undefined1 *)((long)&disconnectPromise.super_PromiseBase.node.ptr + 7);
  kj::Promise<void>::
  then<capnp::_::(anonymous_namespace)::TestCase146::run()::__0,kj::_::PropagateException>
            ((Promise<void> *)(local_250 + 0x10),(Type *)local_250,(PropagateException *)&local_258)
  ;
  kj::Promise<void>::~Promise((Promise<void> *)local_250);
  __n = 2;
  getPersistentCap((anon_unknown_0 *)&request.hook.ptr,
                   (RpcSystem<capnp::rpc::twoparty::VatId> *)local_228,SERVER,TEST_PIPELINE);
  Capability::Client::castAs<capnproto_test::capnp::test::TestPipeline>
            ((Client *)local_278,(Client *)&request.hook.ptr);
  Capability::Client::~Client((Client *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_2d8,(void *)0x0);
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_2c0,(Client *)local_278,&local_2d8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_2d8);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setN((Builder *)local_2c0,0xea);
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&promise.super_Pipeline._typeless.ops.disposer,
             (int *)((long)&serverThread.pipe.ptr + 4));
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_2f0,
             (Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            ((Builder *)local_2c0,&local_2f0);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_2f0);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own
            ((Own<capnp::_::TestInterfaceImpl> *)&promise.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&pipelineRequest.hook.ptr,(int)local_2c0,__buf,__n,(int)pcVar3);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_3b0,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_388,&local_3b0);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_370,&local_388,
             (Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_388);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_3b0);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_370,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelineRequest2.hook.ptr,(int)local_370,__buf_00,__n,(int)pcVar3);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_490,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_468,&local_490);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&local_450,(Client *)(local_468._vptr_Client[-3] + (long)&local_468._vptr_Client));
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_438,&local_450,
             (Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestExtends::Client::~Client(&local_450);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_468);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_490);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_4e0,(int)local_438,__buf_01,__n,(int)pcVar3);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_518,
             (void *)0x0);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_518);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_518);
  if (reverseCallCount != 0) {
    _kj_shouldLog_1 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_520 = 0;
      pcVar3 = "failed: expected (0) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xb6,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",&local_520,&reverseCallCount);
      _kj_shouldLog_1 = false;
    }
  }
  if (serverThread.pipe.ptr._4_4_ != 0) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      pcVar3 = "failed: expected (0) == (reverseCallCount)";
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"(0) == (reverseCallCount)\", 0, reverseCallCount",
                 (char (*) [43])"failed: expected (0) == (reverseCallCount)",
                 (int *)&response.hook.ptr,(int *)((long)&serverThread.pipe.ptr + 4));
      response.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_568,&pipelineRequest2.hook.ptr);
  RVar4 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX((Reader *)local_568);
  local_570 = RVar4.super_StringPtr.content.size_;
  __n_00 = RVar4.super_StringPtr.content.ptr;
  _auStack_578 = __n_00;
  bVar1 = kj::operator==("bar",(StringPtr *)auStack_578);
  if (!bVar1) {
    local_579 = kj::_::Debug::shouldLog(ERROR);
    while (local_579 != false) {
      RVar4 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_568);
      response2.hook.ptr = RVar4.super_StringPtr.content.ptr;
      __n_00 = 
      "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()";
      pcVar3 = "failed: expected (\"bar\") == (response.getX())";
      kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xba,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
                 (char (*) [4])0xa54964,(Reader *)&response2.hook.ptr);
      local_579 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_5d0,
             local_4e0);
  local_5e8 = response2.super_Reader._reader.pointers;
  SStack_5e0 = response2.super_Reader._reader.dataSize;
  SStack_5dc = response2.super_Reader._reader.pointerCount;
  uStack_5da = response2.super_Reader._reader._38_2_;
  local_5f8 = response2.super_Reader._reader.capTable;
  pvStack_5f0 = response2.super_Reader._reader.data;
  pSStack_608 = (SegmentReader *)auStack_5d0;
  pSStack_600 = response2.super_Reader._reader.segment;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffff428;
  checkTestMessage(reader);
  if (reverseCallCount != 3) {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_610 = 3;
      __n_00 = "\"failed: expected \" \"(3) == (callCount)\", 3, callCount";
      pcVar3 = "failed: expected (3) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xbf,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",&local_610,&reverseCallCount);
      _kj_shouldLog_4 = false;
    }
  }
  if (serverThread.pipe.ptr._4_4_ != 1) {
    _kj_shouldLog_5 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      local_618 = 1;
      __n_00 = "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount";
      pcVar3 = "failed: expected (1) == (reverseCallCount)";
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xc0,ERROR,
                 "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
                 (char (*) [43])"failed: expected (1) == (reverseCallCount)",&local_618,
                 (int *)((long)&serverThread.pipe.ptr + 4));
      _kj_shouldLog_5 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_5d0);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_568);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_4e0);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_438);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &pipelineRequest2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_370);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::~Request((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_2c0);
  __flags = (int)pcVar3;
  if ((disconnectPromise.super_PromiseBase.node.ptr._7_1_ & 1) != 0) {
    request_1.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)pcVar3, (bool)request_1.hook.ptr._7_1_ != false) {
      __n_00 = "\"failed: expected \" \"!(disconnected)\"";
      pcVar3 = "failed: expected !(disconnected)";
      kj::_::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xc3,ERROR,"\"failed: expected \" \"!(disconnected)\"",
                 (char (*) [33])"failed: expected !(disconnected)");
      request_1.hook.ptr._7_1_ = false;
    }
  }
  pAVar2 = kj::Own<kj::AsyncIoStream>::operator->
                     ((Own<kj::AsyncIoStream> *)&serverThread.thread.ptr);
  (*(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  kj::Promise<void>::wait((Promise<void> *)(local_250 + 0x10),ioContext.provider.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_670,(void *)0x0);
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_658,(Client *)local_278,&local_670);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_670);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setN((Builder *)local_658,0xea);
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&promise_1.super_Pipeline._typeless.ops.disposer,
             (int *)((long)&serverThread.pipe.ptr + 4));
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_688,
             (Own<capnp::_::TestInterfaceImpl> *)&promise_1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            ((Builder *)local_658,&local_688);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_688);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own
            ((Own<capnp::_::TestInterfaceImpl> *)&promise_1.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&pipelineRequest_1.hook.ptr,(int)local_658,__buf_02,(size_t)__n_00,__flags);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_748,
             (Pipeline *)
             &promise_1.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_720,&local_748);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise_1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_708,&local_720,
             (Maybe<capnp::MessageSize> *)&pipelinePromise_1.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise_1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_720);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_748);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_708,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelineRequest2_1.hook.ptr,(int)local_708,__buf_03,(size_t)__n_00,__flags);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_828,
             (Pipeline *)
             &promise_1.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
              .super_PromiseBase.node.ptr);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_800,&local_828);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&local_7e8,(Client *)(local_800._vptr_Client[-3] + (long)&local_800._vptr_Client));
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2_1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_7d0,&local_7e8,
             (Maybe<capnp::MessageSize> *)&pipelinePromise2_1.super_Pipeline._typeless.ops.disposer)
  ;
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&pipelinePromise2_1.super_Pipeline._typeless.ops.disposer)
  ;
  capnproto_test::capnp::test::TestExtends::Client::~Client(&local_7e8);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_800);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_828);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_878,(int)local_7d0,__buf_04,(size_t)__n_00,__flags);
  ppRStack_9e8 = &pipelineRequest2_1.hook.ptr;
  local_9e0 = &handleCount;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase146::run()::__1>
            (&local_9d8,(kj *)&stack0xfffffffffffff618,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_9d8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_9d8);
  func_00 = extraout_RDX;
  if (!bVar1) {
    local_9e9 = kj::_::Debug::shouldLog(ERROR);
    func_00 = extraout_RDX_00;
    while (local_9e9 != false) {
      kj::_::Debug::log<char_const(&)[110]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr\""
                 ,(char (*) [110])
                  "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr"
                );
      func_00 = extraout_RDX_01;
      local_9e9 = false;
    }
  }
  puStack_b60 = local_878;
  local_b58 = &handleCount;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase146::run()::__2>
            (&local_b50,(kj *)&stack0xfffffffffffff4a0,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_b50,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_b50);
  if (!bVar1) {
    _kj_shouldLog_9 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_9 != false) {
      kj::_::Debug::log<char_const(&)[111]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr\""
                 ,(char (*) [111])
                  "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr"
                );
      _kj_shouldLog_9 = false;
    }
  }
  if (reverseCallCount != 3) {
    local_b62 = kj::_::Debug::shouldLog(ERROR);
    while (local_b62 != false) {
      local_b68 = 3;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xde,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",&local_b68,&reverseCallCount);
      local_b62 = false;
    }
  }
  if (serverThread.pipe.ptr._4_4_ != 1) {
    local_b69 = kj::_::Debug::shouldLog(ERROR);
    while (local_b69 != false) {
      local_b70 = 1;
      kj::_::Debug::log<char_const(&)[43],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
                 (char (*) [43])"failed: expected (1) == (reverseCallCount)",&local_b70,
                 (int *)((long)&serverThread.pipe.ptr + 4));
      local_b69 = false;
    }
  }
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_878);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_7d0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &pipelineRequest2_1.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_708);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest_1.hook.ptr);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::~Request((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_658);
  capnproto_test::capnp::test::TestPipeline::Client::~Client((Client *)local_278);
  kj::Promise<void>::~Promise((Promise<void> *)(local_250 + 0x10));
  RpcSystem<capnp::rpc::twoparty::VatId>::~RpcSystem
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)local_228);
  TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)local_200);
  kj::AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_70);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&handleCount);
  return;
}

Assistant:

TEST(TwoPartyNetwork, Pipelining) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;
  int reverseCallCount = 0;  // Calls back from server to client.

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  bool disconnected = false;
  kj::Promise<void> disconnectPromise = network.onDisconnect().then([&]() { disconnected = true; });

  {
    // Request the particular capability from the server.
    auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
        test::TestSturdyRefObjectId::Tag::TEST_PIPELINE).castAs<test::TestPipeline>();

    {
      // Use the capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      promise = nullptr;  // Just to be annoying, drop the original promise.

      EXPECT_EQ(0, callCount);
      EXPECT_EQ(0, reverseCallCount);

      auto response = pipelinePromise.wait(ioContext.waitScope);
      EXPECT_EQ("bar", response.getX());

      auto response2 = pipelinePromise2.wait(ioContext.waitScope);
      checkTestMessage(response2);

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }

    EXPECT_FALSE(disconnected);

    // What if we disconnect?
    serverThread.pipe->shutdownWrite();

    // The other side should also disconnect.
    disconnectPromise.wait(ioContext.waitScope);

    {
      // Use the now-broken capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      EXPECT_ANY_THROW(pipelinePromise.wait(ioContext.waitScope));
      EXPECT_ANY_THROW(pipelinePromise2.wait(ioContext.waitScope));

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }
  }
}